

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

BeliefLowerBound * __thiscall
despot::BaseRockSample::CreateBeliefLowerBound(BaseRockSample *this,string *name)

{
  bool bVar1;
  RockSampleEastBeliefPolicy *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_00 = (RockSampleEastBeliefPolicy *)operator_new(0x10);
    despot::TrivialBeliefLowerBound::TrivialBeliefLowerBound
              ((TrivialBeliefLowerBound *)this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(name,"EAST");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief lower bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(0);
      }
    }
    this_00 = (RockSampleEastBeliefPolicy *)operator_new(0x18);
    RockSampleEastBeliefPolicy::RockSampleEastBeliefPolicy
              (this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  return &this_00->super_BeliefLowerBound;
}

Assistant:

BeliefLowerBound* BaseRockSample::CreateBeliefLowerBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefLowerBound(this);
	} else if (name == "DEFAULT" || name == "EAST") {
		return new RockSampleEastBeliefPolicy(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(0);
		return NULL;
	}
}